

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O0

void __thiscall
crnlib::dxt_image::set_pixel(dxt_image *this,uint x,uint y,color_quad_u8 *c,bool perceptual)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  uint16 uVar5;
  uint16 packed_delta3;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  etc1_block *this_00;
  color_quad<unsigned_char,_int> *local_160;
  color_quad<unsigned_char,_int> *local_148;
  color_quad<unsigned_char,_int> *local_130;
  dxt3_block *pDXT3_block;
  int comp_index_1;
  uint error_2;
  uint i_2;
  uint best_selector_2;
  uint best_error_2;
  int comp_index;
  uint values [8];
  dxt5_block *pDXT5_block;
  uint local_c8;
  uint error_1;
  uint i_1;
  uint best_selector_1;
  uint best_error_1;
  uint n;
  color_quad_u8 colors [4];
  dxt1_block *pDXT1_block;
  uint error;
  uint i;
  uint best_selector;
  uint best_error;
  color_quad_u8 *pColors;
  uint by;
  uint bx;
  uint16 base_color4_1;
  uint16 base_color4_0;
  uint16 delta_color3;
  uint16 base_color5;
  color_quad_u8 subblock_colors1 [4];
  color_quad_u8 subblock_colors0 [4];
  uint table_index1;
  uint table_index0;
  bool flip_flag;
  bool diff_flag;
  etc1_block *block;
  dxt5_block *pdStack_38;
  uint element_index;
  element *pElement;
  uint block_y;
  uint block_x;
  bool perceptual_local;
  color_quad_u8 *c_local;
  uint y_local;
  uint x_local;
  dxt_image *this_local;
  
  pdStack_38 = (dxt5_block *)get_element(this,x >> 2,y >> 2,0);
  for (block._4_4_ = 0; block._4_4_ < this->m_num_elements_per_block; block._4_4_ = block._4_4_ + 1)
  {
    switch(this->m_element_type[block._4_4_]) {
    case cColorDXT1:
      colors._8_8_ = pdStack_38;
      local_160 = (color_quad<unsigned_char,_int> *)&best_error_1;
      do {
        color_quad<unsigned_char,_int>::color_quad(local_160);
        local_160 = local_160 + 1;
      } while (local_160 != colors + 2);
      uVar6 = dxt1_block::get_low_color((dxt1_block *)colors._8_8_);
      uVar7 = dxt1_block::get_high_color((dxt1_block *)colors._8_8_);
      uVar6 = dxt1_block::get_block_colors
                        ((color_quad_u8 *)&best_error_1,(uint16)uVar6,(uint16)uVar7);
      if ((this->m_format == cDXT1A) && ((c->field_0).field_0.a < 0x80)) {
        dxt1_block::set_selector((dxt1_block *)colors._8_8_,x & 3,y & 3,3);
      }
      else {
        i_1 = 0xffffffff;
        error_1 = 0;
        for (local_c8 = 0; local_c8 < uVar6; local_c8 = local_c8 + 1) {
          uVar7 = crnlib::color::color_distance
                            (perceptual,(color_quad_u8 *)(&best_error_1 + local_c8),c,false);
          if (uVar7 < i_1) {
            error_1 = local_c8;
            i_1 = uVar7;
          }
        }
        dxt1_block::set_selector((dxt1_block *)colors._8_8_,x & 3,y & 3,error_1);
      }
      break;
    case cAlphaDXT3:
      bVar4 = color_quad<unsigned_char,_int>::operator[]
                        (c,(int)this->m_element_component_index[block._4_4_]);
      dxt3_block::set_alpha((dxt3_block *)pdStack_38,x & 3,y & 3,(uint)bVar4,true);
      break;
    case cAlphaDXT5:
      values._24_8_ = pdStack_38;
      uVar6 = dxt5_block::get_low_alpha(pdStack_38);
      uVar7 = dxt5_block::get_high_alpha((dxt5_block *)values._24_8_);
      dxt5_block::get_block_values(&best_error_2,uVar6,uVar7);
      cVar1 = this->m_element_component_index[block._4_4_];
      i_2 = 0xffffffff;
      error_2 = 0;
      for (comp_index_1 = 0; (uint)comp_index_1 < 8; comp_index_1 = comp_index_1 + 1) {
        uVar6 = (&best_error_2)[(uint)comp_index_1];
        bVar4 = color_quad<unsigned_char,_int>::operator[](c,(int)cVar1);
        uVar8 = uVar6 - bVar4;
        if ((int)uVar8 < 1) {
          uVar8 = -uVar8;
        }
        if (uVar8 < i_2) {
          error_2 = comp_index_1;
          i_2 = uVar8;
        }
      }
      dxt5_block::set_selector((dxt5_block *)values._24_8_,x & 3,y & 3,error_2);
      break;
    case cColorETC1:
      this_00 = (etc1_block *)get_element(this,x >> 2,y >> 2,block._4_4_);
      bVar2 = etc1_block::get_diff_bit(this_00);
      bVar3 = etc1_block::get_flip_bit(this_00);
      uVar6 = etc1_block::get_inten_table(this_00,0);
      subblock_colors0[3].field_0 =
           (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
           etc1_block::get_inten_table(this_00,1);
      local_130 = subblock_colors1 + 2;
      do {
        color_quad<unsigned_char,_int>::color_quad(local_130);
        local_130 = local_130 + 1;
      } while (local_130 != subblock_colors0 + 2);
      local_148 = (color_quad<unsigned_char,_int> *)&base_color4_1;
      do {
        color_quad<unsigned_char,_int>::color_quad(local_148);
        local_148 = local_148 + 1;
      } while (local_148 != subblock_colors1 + 2);
      if (bVar2) {
        uVar5 = etc1_block::get_base5_color(this_00);
        packed_delta3 = etc1_block::get_delta3_color(this_00);
        etc1_block::get_diff_subblock_colors(subblock_colors1 + 2,uVar5,uVar6);
        etc1_block::get_diff_subblock_colors
                  ((color_quad_u8 *)&base_color4_1,uVar5,packed_delta3,
                   (uint)subblock_colors0[3].field_0);
      }
      else {
        uVar5 = etc1_block::get_base4_color(this_00,0);
        etc1_block::get_abs_subblock_colors(subblock_colors1 + 2,uVar5,uVar6);
        uVar5 = etc1_block::get_base4_color(this_00,1);
        etc1_block::get_abs_subblock_colors
                  ((color_quad_u8 *)&base_color4_1,uVar5,(uint)subblock_colors0[3].field_0);
      }
      _best_selector = (color_quad_u8 *)&base_color4_1;
      if (bVar3) {
        if ((y & 3) < 3) {
          _best_selector = subblock_colors1 + 2;
        }
      }
      else if ((x & 3) < 3) {
        _best_selector = subblock_colors1 + 2;
      }
      i = 0xffffffff;
      error = 0;
      for (pDXT1_block._4_4_ = 0; pDXT1_block._4_4_ < 4; pDXT1_block._4_4_ = pDXT1_block._4_4_ + 1)
      {
        uVar6 = crnlib::color::color_distance(perceptual,_best_selector + pDXT1_block._4_4_,c,false)
        ;
        if (uVar6 < i) {
          error = pDXT1_block._4_4_;
          i = uVar6;
        }
      }
      etc1_block::set_selector(this_00,x & 3,y & 3,error);
    }
    pdStack_38 = pdStack_38 + 1;
  }
  return;
}

Assistant:

void dxt_image::set_pixel(uint x, uint y, const color_quad_u8& c, bool perceptual)
    {
        CRNLIB_ASSERT((x < m_width) && (y < m_height));

        const uint block_x = x >> cDXTBlockShift;
        const uint block_y = y >> cDXTBlockShift;

        element* pElement = &get_element(block_x, block_y, 0);

        for (uint element_index = 0; element_index < m_num_elements_per_block; element_index++, pElement++)
        {
            switch (m_element_type[element_index])
            {
            case cColorETC1:
            {
                etc1_block& block = *reinterpret_cast<etc1_block*>(&get_element(block_x, block_y, element_index));

                const bool diff_flag = block.get_diff_bit();
                const bool flip_flag = block.get_flip_bit();
                const uint table_index0 = block.get_inten_table(0);
                const uint table_index1 = block.get_inten_table(1);
                color_quad_u8 subblock_colors0[4], subblock_colors1[4];

                if (diff_flag)
                {
                    const uint16 base_color5 = block.get_base5_color();
                    const uint16 delta_color3 = block.get_delta3_color();
                    etc1_block::get_diff_subblock_colors(subblock_colors0, base_color5, table_index0);
                    etc1_block::get_diff_subblock_colors(subblock_colors1, base_color5, delta_color3, table_index1);
                }
                else
                {
                    const uint16 base_color4_0 = block.get_base4_color(0);
                    etc1_block::get_abs_subblock_colors(subblock_colors0, base_color4_0, table_index0);
                    const uint16 base_color4_1 = block.get_base4_color(1);
                    etc1_block::get_abs_subblock_colors(subblock_colors1, base_color4_1, table_index1);
                }

                const uint bx = x & 3;
                const uint by = y & 3;

                color_quad_u8* pColors = subblock_colors1;
                if (flip_flag)
                {
                    if (by <= 2)
                    {
                        pColors = subblock_colors0;
                    }
                }
                else
                {
                    if (bx <= 2)
                    {
                        pColors = subblock_colors0;
                    }
                }

                uint best_error = UINT_MAX;
                uint best_selector = 0;

                for (uint i = 0; i < 4; i++)
                {
                    uint error = color::color_distance(perceptual, pColors[i], c, false);
                    if (error < best_error)
                    {
                        best_error = error;
                        best_selector = i;
                    }
                }

                block.set_selector(bx, by, best_selector);
                break;
            }
            case cColorDXT1:
            {
                dxt1_block* pDXT1_block = reinterpret_cast<dxt1_block*>(pElement);

                color_quad_u8 colors[cDXT1SelectorValues];
                const uint n = pDXT1_block->get_block_colors(colors, static_cast<uint16>(pDXT1_block->get_low_color()), static_cast<uint16>(pDXT1_block->get_high_color()));

                if ((m_format == cDXT1A) && (c.a < 128))
                {
                    pDXT1_block->set_selector(x & 3, y & 3, 3);
                }
                else
                {
                    uint best_error = UINT_MAX;
                    uint best_selector = 0;

                    for (uint i = 0; i < n; i++)
                    {
                        uint error = color::color_distance(perceptual, colors[i], c, false);
                        if (error < best_error)
                        {
                            best_error = error;
                            best_selector = i;
                        }
                    }

                    pDXT1_block->set_selector(x & 3, y & 3, best_selector);
                }

                break;
            }
            case cAlphaDXT5:
            {
                dxt5_block* pDXT5_block = reinterpret_cast<dxt5_block*>(pElement);

                uint values[cDXT5SelectorValues];
                dxt5_block::get_block_values(values, pDXT5_block->get_low_alpha(), pDXT5_block->get_high_alpha());

                const int comp_index = m_element_component_index[element_index];

                uint best_error = UINT_MAX;
                uint best_selector = 0;

                for (uint i = 0; i < cDXT5SelectorValues; i++)
                {
                    uint error = labs((int)values[i] - (int)c[comp_index]); // no need to square

                    if (error < best_error)
                    {
                        best_error = error;
                        best_selector = i;
                    }
                }

                pDXT5_block->set_selector(x & 3, y & 3, best_selector);

                break;
            }
            case cAlphaDXT3:
            {
                const int comp_index = m_element_component_index[element_index];

                dxt3_block* pDXT3_block = reinterpret_cast<dxt3_block*>(pElement);

                pDXT3_block->set_alpha(x & 3, y & 3, c[comp_index], true);

                break;
            }
            default:
                break;
            }
        } // element_index
    }